

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bigint * __thiscall fmt::v7::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  byte bVar4;
  size_t sVar5;
  bigit carry;
  
  this->exp_ = this->exp_ + shift / 0x20;
  if ((int)((long)shift % 0x20) != 0) {
    carry = 0;
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar3 = (this->bigits_).super_buffer<unsigned_int>.size_;
    bVar4 = (byte)((long)shift % 0x20);
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      uVar1 = puVar2[sVar5];
      puVar2[sVar5] = (uVar1 << (bVar4 & 0x1f)) + carry;
      carry = uVar1 >> (0x20 - bVar4 & 0x1f);
    }
    if (carry != 0) {
      buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,&carry);
    }
  }
  return this;
}

Assistant:

FMT_NOINLINE bigint& operator<<=(int shift) {
    assert(shift >= 0);
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }